

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O2

REF_STATUS ref_clump_short_edges_twod(REF_GRID_conflict ref_grid)

{
  double *pdVar1;
  int node0;
  int node1;
  REF_NODE ref_node;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  double dVar10;
  REF_DBL edge_ratio;
  REF_EDGE ref_edge;
  char filename [1024];
  
  ref_node = ref_grid->node;
  uVar2 = ref_edge_create(&ref_edge,ref_grid);
  if (uVar2 == 0) {
    lVar9 = (long)ref_node->max;
    if (lVar9 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x1e7
             ,"ref_clump_short_edges_twod","malloc ratio of REF_DBL negative");
      uVar2 = 1;
    }
    else {
      pvVar4 = malloc(lVar9 * 8);
      if (pvVar4 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x1e7,"ref_clump_short_edges_twod","malloc ratio of REF_DBL NULL");
        uVar2 = 2;
      }
      else {
        for (lVar5 = 0; lVar9 != lVar5; lVar5 = lVar5 + 1) {
          dVar10 = ref_grid->adapt->collapse_ratio;
          *(double *)((long)pvVar4 + lVar5 * 8) = dVar10 + dVar10;
        }
        for (lVar9 = 0; lVar9 < ref_edge->n; lVar9 = lVar9 + 1) {
          node0 = ref_edge->e2n[lVar9 * 2];
          node1 = ref_edge->e2n[lVar9 * 2 + 1];
          uVar2 = ref_node_ratio(ref_node,node0,node1,&edge_ratio);
          if (uVar2 != 0) {
            pcVar8 = "ratio";
            uVar6 = 0x1ed;
            goto LAB_001f3ea1;
          }
          dVar10 = *(double *)((long)pvVar4 + (long)node0 * 8);
          if (edge_ratio <= dVar10) {
            dVar10 = edge_ratio;
          }
          *(double *)((long)pvVar4 + (long)node0 * 8) = dVar10;
          dVar10 = *(double *)((long)pvVar4 + (long)node1 * 8);
          if (edge_ratio <= dVar10) {
            dVar10 = edge_ratio;
          }
          *(double *)((long)pvVar4 + (long)node1 * 8) = dVar10;
        }
        uVar2 = 0;
        uVar7 = 0;
        for (lVar9 = 0; lVar9 < ref_node->max; lVar9 = lVar9 + 1) {
          dVar10 = ref_grid->adapt->collapse_ratio;
          pdVar1 = (double *)((long)pvVar4 + lVar9 * 8);
          if (*pdVar1 <= dVar10 && dVar10 != *pdVar1) {
            snprintf(filename,0x400,"clump%d.t",uVar7);
            uVar3 = ref_clump_tri_around(ref_grid,(REF_INT)lVar9,filename);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x1f6,"ref_clump_short_edges_twod",(ulong)uVar3,"dump");
              return uVar3;
            }
            uVar7 = (ulong)((int)uVar7 + 1);
          }
        }
      }
    }
  }
  else {
    pcVar8 = "orig edges";
    uVar6 = 0x1e4;
LAB_001f3ea1:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar6,
           "ref_clump_short_edges_twod",(ulong)uVar2,pcVar8);
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_clump_short_edges_twod(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT ntarget;
  REF_INT node, node0, node1;
  REF_INT edge;
  REF_DBL edge_ratio;

  char filename[1024];

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc_init(ratio, ref_node_max(ref_node), REF_DBL,
                  2.0 * ref_grid_adapt(ref_grid, collapse_ratio));

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);

    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    ratio[node0] = MIN(ratio[node0], edge_ratio);
    ratio[node1] = MIN(ratio[node1], edge_ratio);
  }

  ntarget = 0;
  for (node = 0; node < ref_node_max(ref_node); node++)
    if (ratio[node] < ref_grid_adapt(ref_grid, collapse_ratio)) {
      snprintf(filename, 1024, "clump%d.t", ntarget);
      RSS(ref_clump_tri_around(ref_grid, node, filename), "dump");
      ntarget++;
    }

  return REF_SUCCESS;
}